

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

pair<slang::ast::Compilation::DefinitionLookupResult,_bool> * __thiscall
slang::ast::Compilation::resolveConfigRule
          (pair<slang::ast::Compilation::DefinitionLookupResult,_bool> *__return_storage_ptr__,
          Compilation *this,Scope *scope,ConfigRule *rule)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  size_t sVar3;
  group_type_pointer pgVar4;
  value_type_pointer ppVar5;
  size_t __n;
  char *__s1;
  RootSymbol *pRVar6;
  group_type_pointer pgVar7;
  value_type_pointer ppVar8;
  ulong uVar9;
  pointer ppCVar10;
  pointer pTVar11;
  ConfigRule *pCVar12;
  pointer ppSVar13;
  uint uVar14;
  undefined1 auVar15 [16];
  uchar uVar16;
  uchar uVar17;
  uchar uVar18;
  uchar uVar19;
  int iVar20;
  DefinitionSymbol *pDVar21;
  uint64_t uVar22;
  SourceLibrary *pSVar23;
  SourceLibrary *pSVar24;
  Diagnostic *pDVar25;
  uint uVar26;
  ulong uVar27;
  ConfigBlockSymbol *this_00;
  ulong uVar28;
  long lVar29;
  value_type_pointer unaff_R12;
  value_type_pointer __u;
  pointer ppCVar30;
  pointer ppSVar31;
  value_type_pointer ppVar32;
  ulong uVar33;
  Symbol *this_01;
  bool bVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  SourceRange SVar37;
  string_view name;
  value_type *elements;
  size_t seed;
  ulong local_98;
  size_t local_50;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*> local_48;
  
  rule->isUsed = true;
  sVar3 = (rule->useCell).lib._M_len;
  if (sVar3 == 0) {
    pSVar23 = this->defaultLibPtr;
    pDVar21 = Symbol::getDeclaringDefinition(scope->thisSym);
    if (pDVar21 != (DefinitionSymbol *)0x0) {
      pSVar23 = pDVar21->sourceLibrary;
    }
LAB_002ed283:
    if ((rule->useCell).targetConfig == false) {
      pRVar6 = (this->root)._M_t.
               super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
               .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
      local_48.
      super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
      .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
      super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl =
           (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)&pRVar6->super_Scope;
      if (pRVar6 == (RootSymbol *)0x0) {
        local_48.
        super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
        .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
        super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl =
             (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)(Scope *)0x0;
      }
      local_48.
      super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
      .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
      _M_head_impl._M_len = (rule->useCell).name._M_len;
      local_48.
      super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
      .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
      _M_head_impl._M_str = (rule->useCell).name._M_str;
      local_50 = 0;
      slang::detail::hashing::
      HashValueImpl<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_1UL>
      ::apply(&local_50,&local_48);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_50;
      uVar33 = SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar15,8) ^
               SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar15,0);
      uVar27 = uVar33 >> ((byte)(this->definitionMap).table_.
                                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                                .arrays.groups_size_index & 0x3f);
      lVar29 = (uVar33 & 0xff) * 4;
      uVar16 = (&UNK_0049b57c)[lVar29];
      uVar17 = (&UNK_0049b57d)[lVar29];
      uVar18 = (&UNK_0049b57e)[lVar29];
      uVar19 = (&UNK_0049b57f)[lVar29];
      uVar28 = 0;
      do {
        pgVar7 = (this->definitionMap).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                 .arrays.groups_;
        pgVar2 = pgVar7 + uVar27;
        auVar36[0] = -(pgVar2->m[0].n == uVar16);
        auVar36[1] = -(pgVar2->m[1].n == uVar17);
        auVar36[2] = -(pgVar2->m[2].n == uVar18);
        auVar36[3] = -(pgVar2->m[3].n == uVar19);
        auVar36[4] = -(pgVar2->m[4].n == uVar16);
        auVar36[5] = -(pgVar2->m[5].n == uVar17);
        auVar36[6] = -(pgVar2->m[6].n == uVar18);
        auVar36[7] = -(pgVar2->m[7].n == uVar19);
        auVar36[8] = -(pgVar2->m[8].n == uVar16);
        auVar36[9] = -(pgVar2->m[9].n == uVar17);
        auVar36[10] = -(pgVar2->m[10].n == uVar18);
        auVar36[0xb] = -(pgVar2->m[0xb].n == uVar19);
        auVar36[0xc] = -(pgVar2->m[0xc].n == uVar16);
        auVar36[0xd] = -(pgVar2->m[0xd].n == uVar17);
        auVar36[0xe] = -(pgVar2->m[0xe].n == uVar18);
        auVar36[0xf] = -(pgVar2->m[0xf].n == uVar19);
        uVar26 = (uint)(ushort)((ushort)(SUB161(auVar36 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar36 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar36 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar36 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar36 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar36 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar36 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar36 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar36 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar36 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar36 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar36 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar36 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar36 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar36 >> 0x77,0) & 1) << 0xe);
        if (uVar26 != 0) {
          ppVar8 = (this->definitionMap).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                   .arrays.elements_;
          do {
            uVar14 = 0;
            if (uVar26 != 0) {
              for (; (uVar26 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
              }
            }
            __u = ppVar8 + uVar27 * 0xf + (ulong)uVar14;
            bVar34 = std::
                     __tuple_compare<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_0UL,_2UL>
                     ::__eq(&local_48,&__u->first);
            if (bVar34) goto LAB_002ed714;
            uVar26 = uVar26 - 1 & uVar26;
          } while (uVar26 != 0);
          __u = unaff_R12;
          if (bVar34) goto LAB_002ed714;
        }
        if ((pgVar7[uVar27].m[0xf].n &
            (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed(unsigned_long)::shift)[(uint)uVar33 & 7]) == 0) {
          __u = (value_type_pointer)0x0;
          goto LAB_002ed714;
        }
        uVar9 = (this->definitionMap).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                .arrays.groups_size_mask;
        lVar29 = uVar27 + uVar28;
        uVar28 = uVar28 + 1;
        uVar27 = lVar29 + 1U & uVar9;
      } while (uVar28 <= uVar9);
      __u = (value_type_pointer)0x0;
LAB_002ed714:
      if (__u != (value_type_pointer)0x0) {
        ppSVar31 = (__u->second).first.
                   super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppSVar13 = (__u->second).first.
                   super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        if (ppSVar31 == ppSVar13) {
          this_01 = (Symbol *)0x0;
        }
        else {
          do {
            this_01 = *ppSVar31;
            pSVar24 = Symbol::getSourceLibrary(this_01);
            if (pSVar24 == pSVar23) goto LAB_002ed757;
            ppSVar31 = ppSVar31 + 1;
          } while (ppSVar31 != ppSVar13);
          this_01 = (Symbol *)0x0;
        }
LAB_002ed757:
        if (this_01 != (Symbol *)0x0) {
          (__return_storage_ptr__->first).definition = this_01;
          (__return_storage_ptr__->first).configRoot = (ConfigBlockSymbol *)0x0;
          (__return_storage_ptr__->first).configRule = rule;
          goto LAB_002ed774;
        }
      }
    }
    uVar22 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                       ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                        &this->configBlocks,&(rule->useCell).name);
    uVar28 = uVar22 >> ((byte)(this->configBlocks).table_.
                              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
                              .arrays.groups_size_index & 0x3f);
    pgVar4 = (this->configBlocks).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
             .arrays.groups_;
    lVar29 = (uVar22 & 0xff) * 4;
    uVar16 = (&UNK_0049b57c)[lVar29];
    uVar17 = (&UNK_0049b57d)[lVar29];
    uVar18 = (&UNK_0049b57e)[lVar29];
    uVar19 = (&UNK_0049b57f)[lVar29];
    ppVar5 = (this->configBlocks).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
             .arrays.elements_;
    __n = (rule->useCell).name._M_len;
    __s1 = (rule->useCell).name._M_str;
    uVar27 = (this->configBlocks).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
             .arrays.groups_size_mask;
    local_98 = 0;
    do {
      pgVar1 = pgVar4 + uVar28;
      auVar35[0] = -(pgVar1->m[0].n == uVar16);
      auVar35[1] = -(pgVar1->m[1].n == uVar17);
      auVar35[2] = -(pgVar1->m[2].n == uVar18);
      auVar35[3] = -(pgVar1->m[3].n == uVar19);
      auVar35[4] = -(pgVar1->m[4].n == uVar16);
      auVar35[5] = -(pgVar1->m[5].n == uVar17);
      auVar35[6] = -(pgVar1->m[6].n == uVar18);
      auVar35[7] = -(pgVar1->m[7].n == uVar19);
      auVar35[8] = -(pgVar1->m[8].n == uVar16);
      auVar35[9] = -(pgVar1->m[9].n == uVar17);
      auVar35[10] = -(pgVar1->m[10].n == uVar18);
      auVar35[0xb] = -(pgVar1->m[0xb].n == uVar19);
      auVar35[0xc] = -(pgVar1->m[0xc].n == uVar16);
      auVar35[0xd] = -(pgVar1->m[0xd].n == uVar17);
      auVar35[0xe] = -(pgVar1->m[0xe].n == uVar18);
      auVar35[0xf] = -(pgVar1->m[0xf].n == uVar19);
      for (uVar26 = (uint)(ushort)((ushort)(SUB161(auVar35 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar35 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar35 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar35 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar35 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar35 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar35 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar35 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar35 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar35 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar35 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar35 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar35 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar35 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar35 >> 0x77,0) & 1) << 0xe); uVar26 != 0;
          uVar26 = uVar26 - 1 & uVar26) {
        uVar14 = 0;
        if (uVar26 != 0) {
          for (; (uVar26 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
          }
        }
        ppVar32 = ppVar5 + uVar28 * 0xf + (ulong)uVar14;
        bVar34 = __n == (ppVar32->first)._M_len;
        if (bVar34 && __n != 0) {
          iVar20 = bcmp(__s1,(ppVar32->first)._M_str,__n);
          bVar34 = iVar20 == 0;
        }
        if (bVar34) goto LAB_002ed5f9;
      }
      if ((pgVar4[uVar28].m[0xf].n &
          (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed(unsigned_long)::shift)[(uint)uVar22 & 7]) == 0) break;
      lVar29 = uVar28 + local_98;
      local_98 = local_98 + 1;
      uVar28 = lVar29 + 1U & uVar27;
    } while (local_98 <= uVar27);
    ppVar32 = (value_type_pointer)0x0;
LAB_002ed5f9:
    if (ppVar32 != (value_type_pointer)0x0) {
      ppCVar10 = (ppVar32->second).
                 super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      for (ppCVar30 = (ppVar32->second).
                      super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppCVar30 != ppCVar10;
          ppCVar30 = ppCVar30 + 1) {
        this_00 = *ppCVar30;
        pSVar24 = Symbol::getSourceLibrary(&this_00->super_Symbol);
        if (pSVar24 == pSVar23) goto LAB_002ed62f;
      }
      this_00 = (ConfigBlockSymbol *)0x0;
LAB_002ed62f:
      if (this_00 != (ConfigBlockSymbol *)0x0) {
        this_00->isUsed = true;
        if (this_00->resolved == false) {
          ConfigBlockSymbol::resolve(this_00);
        }
        if ((this_00->topCells)._M_extent._M_extent_value == 1) {
          pTVar11 = (this_00->topCells)._M_ptr;
          if (rule->paramOverrides != (ParameterValueAssignmentSyntax *)0x0) {
            SVar37 = slang::syntax::SyntaxNode::sourceRange(&rule->paramOverrides->super_SyntaxNode)
            ;
            pDVar25 = Scope::addDiag(scope,(DiagCode)0x2000d,SVar37);
            Diagnostic::operator<<(pDVar25,(this_00->super_Symbol).name);
          }
          pCVar12 = pTVar11->rule;
          (__return_storage_ptr__->first).definition = &pTVar11->definition->super_Symbol;
          (__return_storage_ptr__->first).configRoot = this_00;
          (__return_storage_ptr__->first).configRule = pCVar12;
          goto LAB_002ed774;
        }
        SVar37 = slang::syntax::SyntaxNode::sourceRange
                           ((SyntaxNode *)&(this_00->super_Symbol).originatingSyntax[8].previewNode)
        ;
        pDVar25 = Scope::addDiag(scope,(DiagCode)0x1a000d,SVar37);
        Diagnostic::operator<<(pDVar25,(this_00->super_Symbol).name);
        SVar37 = slang::syntax::SyntaxNode::sourceRange((rule->syntax).ptr);
        Diagnostic::addNote(pDVar25,(DiagCode)0x40001,SVar37);
        goto LAB_002ed6f6;
      }
    }
    errorMissingDef(this,(rule->useCell).name,
                    &((this->root)._M_t.
                      super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                      .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl)->
                     super_Scope,(rule->useCell).sourceRange,(DiagCode)0xcf0006);
  }
  else {
    name._M_str = (rule->useCell).lib._M_str;
    name._M_len = sVar3;
    pSVar23 = getSourceLibrary(this,name);
    if (pSVar23 != (SourceLibrary *)0x0) goto LAB_002ed283;
    pDVar25 = Scope::addDiag(&((this->root)._M_t.
                               super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                               .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl)
                              ->super_Scope,(DiagCode)0x20000d,(rule->useCell).sourceRange);
    Diagnostic::operator<<(pDVar25,(rule->useCell).lib);
  }
LAB_002ed6f6:
  (__return_storage_ptr__->first).definition = (Symbol *)0x0;
  (__return_storage_ptr__->first).configRoot = (ConfigBlockSymbol *)0x0;
  (__return_storage_ptr__->first).configRule = (ConfigRule *)0x0;
LAB_002ed774:
  __return_storage_ptr__->second = true;
  return __return_storage_ptr__;
}

Assistant:

std::pair<Compilation::DefinitionLookupResult, bool> Compilation::resolveConfigRule(
    const Scope& scope, const ConfigRule& rule) const {

    rule.isUsed = true;
    auto& id = rule.useCell;
    SLANG_ASSERT(!id.name.empty());

    // Figure out the target library.
    const SourceLibrary* overrideLib = defaultLibPtr;
    if (id.lib.empty()) {
        if (auto parentDef = scope.asSymbol().getDeclaringDefinition())
            overrideLib = &parentDef->sourceLibrary;
    }
    else {
        overrideLib = getSourceLibrary(id.lib);
        if (!overrideLib) {
            root->addDiag(diag::UnknownLibrary, id.sourceRange) << id.lib;
            return {{}, true};
        }
    }

    if (!id.targetConfig) {
        if (auto overrideDefIt = definitionMap.find({id.name, root.get()});
            overrideDefIt != definitionMap.end()) {
            // There are definitions with this name; find the one that
            // matches our target library.
            auto result = findDefByLib(overrideDefIt->second.first, *overrideLib);
            if (result)
                return {{result, nullptr, &rule}, true};
        }
    }

    // If we didn't find a target definition, try to look for a config.
    if (auto configIt = configBlocks.find(id.name); configIt != configBlocks.end()) {
        auto result = findDefByLib(configIt->second, *overrideLib);
        if (result) {
            result->isUsed = true;
            auto topCells = result->getTopCells();
            if (topCells.size() != 1) {
                auto syntax = result->getSyntax();
                SLANG_ASSERT(syntax);

                auto range = syntax->as<ConfigDeclarationSyntax>().topCells.sourceRange();
                auto& diag = scope.addDiag(diag::NestedConfigMultipleTops, range);
                diag << result->name;
                diag.addNote(diag::NoteConfigRule, rule.syntax->sourceRange());

                return {{}, true};
            }

            if (rule.paramOverrides) {
                scope.addDiag(diag::ConfigParamsIgnored, rule.paramOverrides->sourceRange())
                    << result->name;
            }

            return {{&topCells[0].definition, result, topCells[0].rule}, true};
        }
    }

    // Otherwise we have an error.
    errorMissingDef(id.name, *root, id.sourceRange, diag::UnknownModule);
    return {{}, true};
}